

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

string * __thiscall
flatbuffers::lobster::LobsterGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  char *__s;
  string local_30;
  
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
    GenTypeBasic_abi_cxx11_(&local_30,this,type);
    ConvertCase(__return_storage_ptr__,&local_30,kUpperCamel,kSnake);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    if (type->base_type == BASE_TYPE_STRUCT) {
      __s = "UOffsetTRelative";
      if (type->struct_def->fixed != false) {
        __s = "Struct";
      }
    }
    else {
      __s = "UOffsetTRelative";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMethod(const Type &type) {
    return IsScalar(type.base_type)
               ? ConvertCase(GenTypeBasic(type), Case::kUpperCamel)
               : (IsStruct(type) ? "Struct" : "UOffsetTRelative");
  }